

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_optional_asn1_octet_string(CBS *cbs,CBS *out,int *out_present,CBS_ASN1_TAG tag)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  undefined1 local_40 [4];
  int present;
  CBS child;
  CBS_ASN1_TAG tag_local;
  int *out_present_local;
  CBS *out_local;
  CBS *cbs_local;
  
  child.len._4_4_ = tag;
  iVar1 = CBS_get_optional_asn1(cbs,(CBS *)local_40,&local_44,tag);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (local_44 == 0) {
      CBS_init(out,(uint8_t *)0x0,0);
    }
    else {
      if (out == (CBS *)0x0) {
        __assert_fail("out",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x234,
                      "int CBS_get_optional_asn1_octet_string(CBS *, CBS *, int *, CBS_ASN1_TAG)");
      }
      iVar1 = CBS_get_asn1((CBS *)local_40,out,4);
      if ((iVar1 == 0) || (sVar2 = CBS_len((CBS *)local_40), sVar2 != 0)) {
        return 0;
      }
    }
    if (out_present != (int *)0x0) {
      *out_present = local_44;
    }
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_optional_asn1_octet_string(CBS *cbs, CBS *out, int *out_present,
                                       CBS_ASN1_TAG tag) {
  CBS child;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    assert(out);
    if (!CBS_get_asn1(&child, out, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&child) != 0) {
      return 0;
    }
  } else {
    CBS_init(out, NULL, 0);
  }
  if (out_present) {
    *out_present = present;
  }
  return 1;
}